

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_lambdaref_expression.cpp
# Opt level: O1

void __thiscall
duckdb::BoundLambdaRefExpression::BoundLambdaRefExpression
          (BoundLambdaRefExpression *this,LogicalType *type,ColumnBinding binding,idx_t lambda_idx,
          idx_t depth)

{
  string local_68;
  LogicalType local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&local_48,type);
  BoundLambdaRefExpression(this,&local_68,&local_48,binding,lambda_idx,depth);
  LogicalType::~LogicalType(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

BoundLambdaRefExpression::BoundLambdaRefExpression(LogicalType type, ColumnBinding binding, idx_t lambda_idx,
                                                   idx_t depth)
    : BoundLambdaRefExpression(string(), std::move(type), binding, lambda_idx, depth) {
}